

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall kj::MainBuilder::~MainBuilder(MainBuilder *this)

{
  if ((this->impl).ptr != (Impl *)0x0) {
    (this->impl).ptr = (Impl *)0x0;
    (*(code *)**(undefined8 **)(this->impl).disposer)();
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }